

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brdf_plot.cpp
# Opt level: O2

void __thiscall brdf_plot::setup_camera(brdf_plot *this)

{
  vec<3,_float,_(glm::precision)0> *in_R8;
  vec<3,_float,_(glm::precision)0> vVar1;
  mat4 view_matrix;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_b0;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_a0 [4];
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_60;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  *(undefined8 *)&(this->_sphere_origin).field_0 = 0;
  *(undefined8 *)((long)&(this->_sphere_origin).field_0 + 8) = 0x3f80000000000000;
  local_a0[0]._0_8_ = 0x3f800000bf800000;
  local_a0[0].field_0.z = 1.0;
  vVar1 = glm::detail::compute_normalize<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                    ((vec<3,_float,_(glm::precision)0> *)&local_a0[0].field_0);
  *(ulong *)&(this->_eye_position).field_0 =
       CONCAT44(vVar1.field_0._4_4_ * 1.2,vVar1.field_0._0_4_ * 1.2);
  (this->_eye_position).field_0.field_0.z = vVar1.field_0._8_4_ * 1.2;
  *(undefined8 *)&(this->_eye_target).field_0 = 0;
  (this->_eye_target).field_0.field_0.z = 0.0;
  local_b0._0_8_ = 0;
  local_b0.field_0.z = 1.0;
  glm::lookAtRH<float,(glm::precision)0>
            ((mat<4,_4,_float,_(glm::precision)0> *)&local_a0[0].field_0,(glm *)&this->_eye_position
             ,&this->_sphere_origin,(vec<3,_float,_(glm::precision)0> *)&local_b0.field_0,in_R8);
  glm::detail::compute_inverse<glm::mat,_4,_4,_float,_(glm::precision)0,_false>::call
            ((mat<4,_4,_float,_(glm::precision)0> *)&local_60.field_0,
             (mat<4,_4,_float,_(glm::precision)0> *)&local_a0[0].field_0);
  *(undefined8 *)&(this->_view_matrix_inv).value[3].field_0 = local_30;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[3].field_0 + 8) = uStack_28;
  *(undefined8 *)&(this->_view_matrix_inv).value[2].field_0 = local_40;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[2].field_0 + 8) = uStack_38;
  *(undefined8 *)&(this->_view_matrix_inv).value[1].field_0 = local_50;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[1].field_0 + 8) = uStack_48;
  *(undefined8 *)&(this->_view_matrix_inv).value[0].field_0 = local_60._0_8_;
  *(undefined8 *)((long)&(this->_view_matrix_inv).value[0].field_0 + 8) = local_60._8_8_;
  return;
}

Assistant:

void brdf_plot::setup_camera()
{
  _sphere_origin = {0.0, 0.0f, 0.0f};
  _sphere_radius = 1.0f;

  _eye_position = 1.2f * glm::normalize(glm::vec3{-1.0f, 1.0f, 1.0f});
  _eye_target = {0.0f, 0.0f, 0.0f};

  glm::vec3 up_vector{0.0f, 0.0f, 1.0f};
  glm::mat4 view_matrix = glm::lookAt(_eye_position, _sphere_origin, up_vector);

  _view_matrix_inv = glm::inverse(view_matrix);
}